

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

void loguru::print_preamble
               (char *out_buff,size_t out_buff_size,Verbosity verbosity,char *file,uint line)

{
  int iVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  undefined4 in_register_00000014;
  ulong uVar6;
  char level_buff [6];
  tm time_info;
  time_t sec_since_epoch;
  char thread_name [17];
  char shortened_filename [24];
  
  *out_buff = '\0';
  if (g_preamble == '\x01') {
    lVar2 = std::chrono::_V2::system_clock::now();
    sec_since_epoch = lVar2 / 1000000000;
    localtime_r(&sec_since_epoch,(tm *)&time_info);
    lVar3 = std::chrono::_V2::steady_clock::now();
    lVar3 = lVar3 - s_start_time;
    thread_name[0] = '\0';
    thread_name[1] = '\0';
    thread_name[2] = '\0';
    thread_name[3] = '\0';
    thread_name[4] = '\0';
    thread_name[5] = '\0';
    thread_name[6] = '\0';
    thread_name[7] = '\0';
    thread_name[8] = '\0';
    thread_name[9] = '\0';
    thread_name[10] = '\0';
    thread_name[0xb] = '\0';
    thread_name[0xc] = '\0';
    thread_name[0xd] = '\0';
    thread_name[0xe] = '\0';
    thread_name[0xf] = '\0';
    thread_name[0x10] = '\0';
    get_thread_name(thread_name,0x11,true);
    pcVar4 = filename((char *)CONCAT44(in_register_00000014,verbosity));
    pcVar5 = get_verbosity_name((Verbosity)out_buff_size);
    if (pcVar5 == (char *)0x0) {
      snprintf(level_buff,5,"% 4d",out_buff_size & 0xffffffff);
    }
    else {
      snprintf(level_buff,5,"%s",pcVar5);
    }
    if (g_preamble_date == '\x01') {
      iVar1 = snprintf(out_buff,0x5c,"%04d-%02d-%02d ",(ulong)(time_info.tm_year + 0x76c),
                       (ulong)(time_info.tm_mon + 1),(ulong)(uint)time_info.tm_mday);
      uVar6 = (ulong)iVar1;
    }
    else {
      uVar6 = 0;
    }
    if ((uVar6 < 0x5c) && (g_preamble_time != '\0')) {
      iVar1 = snprintf(out_buff + uVar6,0x5c - uVar6,"%02d:%02d:%02d.%03lld ",
                       (ulong)(uint)time_info.tm_hour,(ulong)(uint)time_info.tm_min,
                       (ulong)(uint)time_info.tm_sec,(lVar2 / 1000000) % 1000);
      uVar6 = uVar6 + (long)iVar1;
    }
    if ((g_preamble_uptime == '\x01') && (uVar6 < 0x5c)) {
      iVar1 = snprintf(out_buff + uVar6,0x5c - uVar6,"(%8.3fs) ",(double)(lVar3 / 1000000) / 1000.0)
      ;
      uVar6 = uVar6 + (long)iVar1;
    }
    if ((g_preamble_thread == '\x01') && (uVar6 < 0x5c)) {
      iVar1 = snprintf(out_buff + uVar6,0x5c - uVar6,"[%-*s]",0x10,thread_name);
      uVar6 = uVar6 + (long)iVar1;
    }
    if ((g_preamble_file == '\x01') && (uVar6 < 0x5c)) {
      snprintf(shortened_filename,0x18,"%s",pcVar4);
      iVar1 = snprintf(out_buff + uVar6,0x5c - uVar6,"%*s:%-5u ",0x17,shortened_filename,
                       (ulong)file & 0xffffffff);
      uVar6 = uVar6 + (long)iVar1;
    }
    if ((g_preamble_verbose == '\x01') && (uVar6 < 0x5c)) {
      iVar1 = snprintf(out_buff + uVar6,0x5c - uVar6,"%4s",level_buff);
      uVar6 = uVar6 + (long)iVar1;
    }
    if ((g_preamble_pipe == '\x01') && (uVar6 < 0x5c)) {
      snprintf(out_buff + uVar6,0x5c - uVar6,"| ");
    }
  }
  return;
}

Assistant:

static void print_preamble(char* out_buff, size_t out_buff_size, Verbosity verbosity, const char* file, unsigned line)
	{
		if (out_buff_size == 0) { return; }
		out_buff[0] = '\0';
		if (!g_preamble) { return; }
		long long ms_since_epoch = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();
		time_t sec_since_epoch = time_t(ms_since_epoch / 1000);
		tm time_info;
		localtime_r(&sec_since_epoch, &time_info);

		auto uptime_ms = duration_cast<milliseconds>(steady_clock::now() - s_start_time).count();
		auto uptime_sec = static_cast<double> (uptime_ms) / 1000.0;

		char thread_name[LOGURU_THREADNAME_WIDTH + 1] = {0};
		get_thread_name(thread_name, LOGURU_THREADNAME_WIDTH + 1, true);

		if (s_strip_file_path) {
			file = filename(file);
		}

		char level_buff[6];
		const char* custom_level_name = get_verbosity_name(verbosity);
		if (custom_level_name) {
			snprintf(level_buff, sizeof(level_buff) - 1, "%s", custom_level_name);
		} else {
			snprintf(level_buff, sizeof(level_buff) - 1, "% 4d", verbosity);
		}

		long pos = 0;

		if (g_preamble_date && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "%04d-%02d-%02d ",
				             1900 + time_info.tm_year, 1 + time_info.tm_mon, time_info.tm_mday);
		}
		if (g_preamble_time && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "%02d:%02d:%02d.%03lld ",
			               time_info.tm_hour, time_info.tm_min, time_info.tm_sec, ms_since_epoch % 1000);
		}
		if (g_preamble_uptime && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "(%8.3fs) ",
			               uptime_sec);
		}
		if (g_preamble_thread && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "[%-*s]",
			               LOGURU_THREADNAME_WIDTH, thread_name);
		}
		if (g_preamble_file && pos < out_buff_size) {
			char shortened_filename[LOGURU_FILENAME_WIDTH + 1];
			snprintf(shortened_filename, LOGURU_FILENAME_WIDTH + 1, "%s", file);
			pos += snprintf(out_buff + pos, out_buff_size - pos, "%*s:%-5u ",
			               LOGURU_FILENAME_WIDTH, shortened_filename, line);
		}
		if (g_preamble_verbose && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "%4s",
			               level_buff);
		}
		if (g_preamble_pipe && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "| ");
		}
	}